

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O1

bool Assimp::IFC::ProcessProfile(IfcProfileDef *prof,TempMesh *meshout,ConversionData *conv)

{
  _func_int **pp_Var1;
  uint *puVar2;
  long lVar3;
  IfcBoundedCurve *curve;
  IfcParameterizedProfileDef *def;
  long *plVar4;
  size_type *psVar5;
  _func_int *p_Var6;
  allocator<char> local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [376];
  
  pp_Var1 = (prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
            _vptr_ObjectHelper;
  p_Var6 = (_func_int *)
           ((long)&(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                   _vptr_ObjectHelper + (long)pp_Var1[-3]);
  lVar3 = __dynamic_cast(p_Var6,&STEP::Object::typeinfo,
                         &Schema_2x3::IfcArbitraryClosedProfileDef::typeinfo,0xffffffffffffffff);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(p_Var6,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcArbitraryOpenProfileDef::typeinfo,0xffffffffffffffff);
    if (lVar3 == 0) {
      def = (IfcParameterizedProfileDef *)
            __dynamic_cast(p_Var6,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcParameterizedProfileDef::typeinfo,0xffffffffffffffff);
      if (def == (IfcParameterizedProfileDef *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c0,
                   *(char **)(&(prof->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                               field_0x10 + (long)pp_Var1[-3]),&local_1e1);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,0x6e3272);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_1e0.field_2._M_allocated_capacity = *psVar5;
          local_1e0.field_2._8_8_ = plVar4[3];
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        }
        else {
          local_1e0.field_2._M_allocated_capacity = *psVar5;
          local_1e0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1e0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a0,
                   &local_1e0);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
        }
        if (local_1c0[0] != local_1b0) {
          operator_delete(local_1c0[0],local_1b0[0] + 1);
        }
      }
      else {
        ProcessParametrizedProfile(def,meshout,conv);
      }
      if (def == (IfcParameterizedProfileDef *)0x0) {
        return false;
      }
      goto LAB_0054b1af;
    }
    curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                      (*(LazyObject **)(lVar3 + 0x68));
  }
  else {
    curve = (IfcBoundedCurve *)
            STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>(*(LazyObject **)(lVar3 + 0x68));
  }
  ProcessCurve(&curve->super_IfcCurve,meshout,conv);
LAB_0054b1af:
  TempMesh::RemoveAdjacentDuplicates(meshout);
  puVar2 = (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar2) {
    return false;
  }
  return 1 < *puVar2;
}

Assistant:

bool ProcessProfile(const Schema_2x3::IfcProfileDef& prof, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcArbitraryClosedProfileDef* const cprofile = prof.ToPtr<Schema_2x3::IfcArbitraryClosedProfileDef>()) {
        ProcessClosedProfile(*cprofile,meshout,conv);
    }
    else if(const Schema_2x3::IfcArbitraryOpenProfileDef* const copen = prof.ToPtr<Schema_2x3::IfcArbitraryOpenProfileDef>()) {
        ProcessOpenProfile(*copen,meshout,conv);
    }
    else if(const Schema_2x3::IfcParameterizedProfileDef* const cparam = prof.ToPtr<Schema_2x3::IfcParameterizedProfileDef>()) {
        ProcessParametrizedProfile(*cparam,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcProfileDef entity, type is " + prof.GetClassName());
        return false;
    }
    meshout.RemoveAdjacentDuplicates();
    if (!meshout.mVertcnt.size() || meshout.mVertcnt.front() <= 1) {
        return false;
    }
    return true;
}